

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O1

double __thiscall
VarianceSwapsHestonAnalyticalPricer::uiTerm
          (VarianceSwapsHestonAnalyticalPricer *this,double t1,double t2)

{
  double dVar1;
  double dVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar3;
  double dVar4;
  double dVar5;
  complex<double> __r;
  complex<double> D1;
  complex<double> C1;
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  double local_28;
  double dStack_20;
  
  dVar3 = t2 - t1;
  dVar1 = qtildeTerm(this);
  dVar5 = wTerm(this,t1);
  dVar2 = cTerm(this,t1);
  dVar4 = 0.0;
  functionCPrime(this,dVar3,0.0);
  local_28 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  dStack_20 = dVar4;
  functionCSecond(this,dVar3,0.0);
  dVar4 = 0.0;
  functionDPrime(this,dVar3,0.0);
  local_38 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_30 = dVar4;
  functionDSecond(this,dVar3,0.0);
  dVar3 = dVar1 + dVar5;
  dStack_40 = dVar3 * dVar3 + dVar5 + dVar5 + dVar1;
  local_48 = local_38 * dStack_40;
  dStack_40 = dStack_40 * local_30;
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)&local_38);
  dVar5 = local_48 / (dVar2 * dVar2);
  local_48 = local_28 + local_28;
  dStack_40 = dStack_20 + dStack_20;
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)&local_38);
  dVar1 = local_48 - (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  local_48 = local_28;
  dStack_40 = dStack_20;
  std::complex<double>::operator*=((complex<double> *)&local_48,(complex<double> *)&local_28);
  return (local_48 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) +
         (dVar1 * dVar3) / dVar2 + dVar5;
}

Assistant:

double VarianceSwapsHestonAnalyticalPricer::
uiTerm(double t1, double t2) const {
    double delta = t2-t1,
           qtilde = qtildeTerm(),
           Wi = wTerm(t1),
           ci = cTerm(t1);
    std::complex<double> C1 = functionCPrime(delta,0.),
           C2 = functionCSecond(delta,0.),
           D1 = functionDPrime(delta,0.),
           D2 = functionDSecond(delta,0.);
    std::complex<double> firstTerm = (qtilde+2*Wi+(qtilde + Wi)*(qtilde + Wi)) 
                                        *D1*D1/(ci*ci),
                        secondTerm = (qtilde+Wi)*(2.0*C1*D1 - D2) / ci,
                        thirdTerm= C1*C1 - C2;
    std::complex<double> ui = firstTerm+secondTerm+thirdTerm;
    return ui.real();
}